

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memchr.c
# Opt level: O2

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
    TESTCASE( memchr( abcde, 'c', 5 ) == &abcde[2] );
    TESTCASE( memchr( abcde, 'a', 1 ) == &abcde[0] );
    TESTCASE( memchr( abcde, 'a', 0 ) == NULL );
    TESTCASE( memchr( abcde, '\0', 5 ) == NULL );
    TESTCASE( memchr( abcde, '\0', 6 ) == &abcde[5] );
    return TEST_RESULTS;
}